

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Chapters::ExpandChaptersArray(Chapters *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  ulong *puVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  Chapter *pCVar10;
  long lVar11;
  
  iVar3 = this->chapters_size_;
  if (this->chapters_count_ < iVar3) {
    return true;
  }
  iVar7 = 1;
  if (iVar3 != 0) {
    iVar7 = iVar3 * 2;
  }
  uVar9 = (ulong)iVar7;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar9;
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x30),8) == 0) {
    uVar8 = SUB168(auVar4 * ZEXT816(0x30),0) | 8;
  }
  puVar6 = (ulong *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
  if (puVar6 == (ulong *)0x0) {
    return false;
  }
  *puVar6 = uVar9;
  lVar11 = 0;
  pCVar10 = (Chapter *)(puVar6 + 1);
  do {
    Chapter::Chapter(pCVar10);
    lVar11 = lVar11 + -0x30;
    pCVar10 = pCVar10 + 1;
  } while (-lVar11 != uVar9 * 0x30);
  iVar3 = this->chapters_count_;
  pCVar10 = this->chapters_;
  if ((long)iVar3 < 1) {
    if (pCVar10 == (Chapter *)0x0) goto LAB_0015309d;
  }
  else {
    lVar11 = 0;
    do {
      *(undefined8 *)((long)puVar6 + lVar11 + 8) = *(undefined8 *)((long)&pCVar10->id_ + lVar11);
      puVar1 = (undefined8 *)((long)&pCVar10->start_timecode_ + lVar11);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)puVar6 + lVar11 + 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      *(undefined8 *)((long)puVar6 + lVar11 + 0x20) = *(undefined8 *)((long)&pCVar10->uid_ + lVar11)
      ;
      *(undefined8 *)((long)puVar6 + lVar11 + 0x28) =
           *(undefined8 *)((long)&pCVar10->displays_ + lVar11);
      *(undefined8 *)((long)puVar6 + lVar11 + 0x30) =
           *(undefined8 *)((long)&pCVar10->displays_size_ + lVar11);
      lVar11 = lVar11 + 0x30;
    } while ((long)iVar3 * 0x30 != lVar11);
  }
  if (*(long *)&pCVar10[-1].displays_size_ != 0) {
    lVar11 = *(long *)&pCVar10[-1].displays_size_ * 0x30;
    do {
      Chapter::~Chapter((Chapter *)((long)&pCVar10[-1].id_ + lVar11));
      lVar11 = lVar11 + -0x30;
    } while (lVar11 != 0);
  }
  operator_delete__(&pCVar10[-1].displays_size_);
LAB_0015309d:
  this->chapters_ = (Chapter *)(puVar6 + 1);
  this->chapters_size_ = iVar7;
  return true;
}

Assistant:

bool Chapters::ExpandChaptersArray() {
  if (chapters_size_ > chapters_count_)
    return true;  // nothing to do yet

  const int size = (chapters_size_ == 0) ? 1 : 2 * chapters_size_;

  Chapter* const chapters = new (std::nothrow) Chapter[size];  // NOLINT
  if (chapters == NULL)
    return false;

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& src = chapters_[idx];
    Chapter* const dst = chapters + idx;
    src.ShallowCopy(dst);
  }

  delete[] chapters_;

  chapters_ = chapters;
  chapters_size_ = size;

  return true;
}